

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_call
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t result,sysbvm_tuple_t function,sysbvm_tuple_t arguments)

{
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t value;
  sysbvm_tuple_t instruction;
  size_t i;
  sysbvm_tuple_t operands;
  size_t argumentCount;
  sysbvm_tuple_t arguments_local;
  sysbvm_tuple_t function_local;
  sysbvm_tuple_t result_local;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_array_getSize(arguments);
  sysbvm_functionBytecodeAssembler_countExtension(context,assembler,sVar1 >> 4);
  sVar2 = sysbvm_array_create(context,sVar1 + 2);
  sysbvm_array_atPut(sVar2,0,result);
  sysbvm_array_atPut(sVar2,1,function);
  for (instruction = 0; instruction < sVar1; instruction = instruction + 1) {
    value = sysbvm_array_at(arguments,instruction);
    sysbvm_array_atPut(sVar2,instruction + 2,value);
  }
  sVar2 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'@',sVar2);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar2);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_call(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t result, sysbvm_tuple_t function, sysbvm_tuple_t arguments)
{
    size_t argumentCount = sysbvm_array_getSize(arguments);
    sysbvm_functionBytecodeAssembler_countExtension(context, assembler, argumentCount>>4);

    sysbvm_tuple_t operands = sysbvm_array_create(context, 2 + argumentCount);
    sysbvm_array_atPut(operands, 0, result);
    sysbvm_array_atPut(operands, 1, function);
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_array_atPut(operands, 2 + i, sysbvm_array_at(arguments, i));
    
    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_CALL, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}